

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_changeCoeff(HModel *this,int row,int col,double newval)

{
  value_type vVar1;
  value_type vVar2;
  reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  uint in_EDX;
  uint in_ESI;
  size_type in_RDI;
  value_type in_XMM0_Qa;
  int el_1;
  int i;
  int nwNnonz;
  int el;
  int cg_el;
  undefined4 in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_20;
  int local_1c;
  
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n",in_XMM0_Qa,(ulong)in_ESI,
         (ulong)in_EDX);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  local_1c = -1;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)in_EDX);
  local_20 = *pvVar3;
  do {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                        (long)(int)(in_EDX + 1));
    if (*pvVar3 <= local_20) {
LAB_00185049:
      if (local_1c < 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                            (long)(int)(in_EDX + 1));
        local_1c = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                            (long)*(int *)(in_RDI + 0x60c));
        vVar2 = *pvVar3;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
        for (local_28 = in_EDX + 1; local_28 <= *(int *)(in_RDI + 0x60c); local_28 = local_28 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_28);
          *pvVar3 = *pvVar3 + 1;
        }
        for (; local_1c < vVar2; vVar2 = vVar2 + -1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),
                              (long)(vVar2 + -1));
          in_stack_ffffffffffffffb4 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)vVar2);
          *pvVar3 = in_stack_ffffffffffffffb4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)(vVar2 + -1));
          vVar1 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)vVar2);
          *pvVar5 = vVar1;
        }
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),(long)local_1c
                         );
      *pvVar5 = in_XMM0_Qa;
      mlFg_Update((HModel *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (int)((ulong)in_XMM0_Qa >> 0x20));
      return;
    }
    puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_20
                               );
    if (*puVar4 == in_ESI) {
      local_1c = local_20;
      goto LAB_00185049;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void HModel::util_changeCoeff(int row, int col, const double newval) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n", row, col, newval);cout << flush;
#endif
  //  printf("\n\nCalled model.util_changeCoeff(row=%d, col=%d, newval=%g)\n\n", row, col, newval);cout << flush;

  //  util_reportModel();
  int cg_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
  //    printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);
    if (Aindex[el] == row) {
      cg_el = el;
      break;
    }
  }
  if (cg_el < 0) {
  //    printf("model.util_changeCoeff: Cannot find row %d in column %d\n", row, col);
    cg_el = Astart[col+1];
    int nwNnonz = Astart[numCol] + 1;
    //    printf("model.util_changeCoeff: Increasing Nnonz from %d to %d\n", Astart[numCol], nwNnonz);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);
    for (int i=col+1; i<=numCol; i++) Astart[i]++;
    for (int el=nwNnonz-1; el>cg_el; el--) {
      Aindex[el] = Aindex[el-1];
      Avalue[el] = Avalue[el-1];
    }
  }    
  Avalue[cg_el] = newval;

  //Deduce the consequences of a changed element
  //ToDo: Can do something more intelligent if element is in nonbasic column. Otherwise, treat it as if 
  mlFg_Update(mlFg_action_NewRows);
  //  util_reportModel();

}